

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::find_or_prepare_insert_non_soo<char[13]>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *this,char (*key) [13])

{
  ctrl_t *pcVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  ushort uVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  undefined1 uVar38;
  bool bVar39;
  ushort uVar40;
  uint uVar41;
  size_t sVar42;
  uint64_t uVar43;
  ctrl_t *pcVar44;
  ulong uVar45;
  CommonFields *common;
  size_t sVar46;
  uint uVar47;
  PolicyFunctions *policy;
  uchar *bytes;
  ulong uVar48;
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i match;
  undefined1 auVar52 [16];
  FindInfo target;
  ulong local_a8;
  char (*local_78) [13];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  _Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_68;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  sVar42 = strlen(*key);
  uVar43 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,key,sVar42);
  uVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar45 = (uVar43 ^ sVar42) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar45 >> 0x38 | (uVar45 & 0xff000000000000) >> 0x28 | (uVar45 & 0xff0000000000) >> 0x18
            | (uVar45 & 0xff00000000) >> 8 | (uVar45 & 0xff000000) << 8 |
            (uVar45 & 0xff0000) << 0x18 | (uVar45 & 0xff00) << 0x28 | uVar45 << 0x38);
  pcVar44 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.control;
  uVar48 = (ulong)common >> 7 ^ (ulong)pcVar44 >> 0xc;
  uVar38 = (undefined1)(uVar45 >> 0x38);
  auVar50 = ZEXT216(CONCAT11(uVar38,uVar38) & 0x7f7f);
  auVar50 = pshuflw(auVar50,auVar50,0);
  uVar49 = auVar50._0_4_;
  auVar50._4_4_ = uVar49;
  auVar50._0_4_ = uVar49;
  auVar50._8_4_ = uVar49;
  auVar50._12_4_ = uVar49;
  local_a8 = 0;
  do {
    uVar48 = uVar48 & uVar2;
    pcVar1 = pcVar44 + uVar48;
    auVar51[0] = -(auVar50[0] == *pcVar1);
    auVar51[1] = -(auVar50[1] == pcVar1[1]);
    auVar51[2] = -(auVar50[2] == pcVar1[2]);
    auVar51[3] = -(auVar50[3] == pcVar1[3]);
    auVar51[4] = -(auVar50[4] == pcVar1[4]);
    auVar51[5] = -(auVar50[5] == pcVar1[5]);
    auVar51[6] = -(auVar50[6] == pcVar1[6]);
    auVar51[7] = -(auVar50[7] == pcVar1[7]);
    auVar51[8] = -(auVar50[8] == pcVar1[8]);
    auVar51[9] = -(auVar50[9] == pcVar1[9]);
    auVar51[10] = -(auVar50[10] == pcVar1[10]);
    auVar51[0xb] = -(auVar50[0xb] == pcVar1[0xb]);
    auVar51[0xc] = -(auVar50[0xc] == pcVar1[0xc]);
    auVar51[0xd] = -(auVar50[0xd] == pcVar1[0xd]);
    auVar51[0xe] = -(auVar50[0xe] == pcVar1[0xe]);
    auVar51[0xf] = -(auVar50[0xf] == pcVar1[0xf]);
    uVar40 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
    policy = (PolicyFunctions *)(ulong)uVar40;
    cVar22 = *pcVar1;
    cVar23 = pcVar1[1];
    cVar24 = pcVar1[2];
    cVar25 = pcVar1[3];
    cVar26 = pcVar1[4];
    cVar27 = pcVar1[5];
    cVar28 = pcVar1[6];
    cVar29 = pcVar1[7];
    cVar30 = pcVar1[8];
    cVar31 = pcVar1[9];
    cVar32 = pcVar1[10];
    cVar33 = pcVar1[0xb];
    cVar34 = pcVar1[0xc];
    cVar35 = pcVar1[0xd];
    cVar36 = pcVar1[0xe];
    cVar37 = pcVar1[0xf];
    cVar6 = local_58;
    cVar7 = cStack_57;
    cVar8 = cStack_56;
    cVar9 = cStack_55;
    cVar10 = cStack_54;
    cVar11 = cStack_53;
    cVar12 = cStack_52;
    cVar13 = cStack_51;
    cVar14 = cStack_50;
    cVar15 = cStack_4f;
    cVar16 = cStack_4e;
    cVar17 = cStack_4d;
    cVar18 = cStack_4c;
    cVar19 = cStack_4b;
    cVar20 = cStack_4a;
    cVar21 = cStack_49;
    while (cStack_49 = cVar37, cStack_4a = cVar36, cStack_4b = cVar35, cStack_4c = cVar34,
          cStack_4d = cVar33, cStack_4e = cVar32, cStack_4f = cVar31, cStack_50 = cVar30,
          cStack_51 = cVar29, cStack_52 = cVar28, cStack_53 = cVar27, cStack_54 = cVar26,
          cStack_55 = cVar25, cStack_56 = cVar24, cStack_57 = cVar23, local_58 = cVar22, uVar40 != 0
          ) {
      uVar41 = 0;
      uVar47 = (uint)policy;
      if (uVar47 != 0) {
        for (; (uVar47 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      lVar3 = *(long *)((long)&(this->settings_).
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      sVar46 = uVar41 + uVar48 & uVar2;
      local_68._M_head_impl =
           (basic_string_view<char,_std::char_traits<char>_> *)(lVar3 + sVar46 * 0x30);
      local_60._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (lVar3 + sVar46 * 0x30 + 0x10);
      local_78 = key;
      local_70 = this;
      local_48 = auVar50;
      bVar39 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::EqualElement<char[13]>::operator()
                         ((EqualElement<char[13]> *)&local_78,local_68._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
                          &local_68,
                          (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           *)&local_60);
      if (bVar39) {
        pcVar44 = (this->settings_).
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (pcVar44 == (ctrl_t *)0x0) goto LAB_001fe407;
        pcVar44 = pcVar44 + sVar46;
        bVar39 = false;
        goto LAB_001fe3b5;
      }
      uVar40 = (ushort)(uVar47 - 1) & (ushort)policy;
      policy = (PolicyFunctions *)(ulong)CONCAT22((short)(uVar47 - 1 >> 0x10),uVar40);
      auVar50 = local_48;
      cVar22 = local_58;
      cVar23 = cStack_57;
      cVar24 = cStack_56;
      cVar25 = cStack_55;
      cVar26 = cStack_54;
      cVar27 = cStack_53;
      cVar28 = cStack_52;
      cVar29 = cStack_51;
      cVar30 = cStack_50;
      cVar31 = cStack_4f;
      cVar32 = cStack_4e;
      cVar33 = cStack_4d;
      cVar34 = cStack_4c;
      cVar35 = cStack_4b;
      cVar36 = cStack_4a;
      cVar37 = cStack_49;
      cVar6 = local_58;
      cVar7 = cStack_57;
      cVar8 = cStack_56;
      cVar9 = cStack_55;
      cVar10 = cStack_54;
      cVar11 = cStack_53;
      cVar12 = cStack_52;
      cVar13 = cStack_51;
      cVar14 = cStack_50;
      cVar15 = cStack_4f;
      cVar16 = cStack_4e;
      cVar17 = cStack_4d;
      cVar18 = cStack_4c;
      cVar19 = cStack_4b;
      cVar20 = cStack_4a;
      cVar21 = cStack_49;
    }
    auVar52[0] = -(local_58 == kEmpty);
    auVar52[1] = -(cStack_57 == kEmpty);
    auVar52[2] = -(cStack_56 == kEmpty);
    auVar52[3] = -(cStack_55 == kEmpty);
    auVar52[4] = -(cStack_54 == kEmpty);
    auVar52[5] = -(cStack_53 == kEmpty);
    auVar52[6] = -(cStack_52 == kEmpty);
    auVar52[7] = -(cStack_51 == kEmpty);
    auVar52[8] = -(cStack_50 == kEmpty);
    auVar52[9] = -(cStack_4f == kEmpty);
    auVar52[10] = -(cStack_4e == kEmpty);
    auVar52[0xb] = -(cStack_4d == kEmpty);
    auVar52[0xc] = -(cStack_4c == kEmpty);
    auVar52[0xd] = -(cStack_4b == kEmpty);
    auVar52[0xe] = -(cStack_4a == kEmpty);
    auVar52[0xf] = -(cStack_49 == kEmpty);
    uVar40 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    local_58 = cVar6;
    cStack_57 = cVar7;
    cStack_56 = cVar8;
    cStack_55 = cVar9;
    cStack_54 = cVar10;
    cStack_53 = cVar11;
    cStack_52 = cVar12;
    cStack_51 = cVar13;
    cStack_50 = cVar14;
    cStack_4f = cVar15;
    cStack_4e = cVar16;
    cStack_4d = cVar17;
    cStack_4c = cVar18;
    cStack_4b = cVar19;
    cStack_4a = cVar20;
    cStack_49 = cVar21;
    if (uVar40 != 0) {
      bVar39 = ShouldInsertBackwardsForDebug
                         ((this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_,(size_t)common,
                          (this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control);
      if (bVar39) {
        uVar5 = 0xf;
        if (uVar40 != 0) {
          for (; uVar40 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar41 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar41 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                   ::GetPolicyFunctions()::value;
      target.offset = local_a8;
      sVar46 = PrepareInsertNonSoo((container_internal *)this,common,uVar41 + uVar48 & uVar2,target,
                                   policy);
      pcVar44 = (this->settings_).
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.control;
      if (pcVar44 == (ctrl_t *)0x0) {
LAB_001fe407:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>]"
                     );
      }
      pcVar44 = pcVar44 + sVar46;
      bVar39 = true;
LAB_001fe3b5:
      pvVar4 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.slot_array.p;
      (__return_storage_ptr__->first).ctrl_ = pcVar44;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(sVar46 * 0x30 + (long)pvVar4);
      __return_storage_ptr__->second = bVar39;
      return __return_storage_ptr__;
    }
    uVar48 = uVar48 + local_a8 + 0x10;
    local_a8 = local_a8 + 0x10;
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < local_a8) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>, K = char[13]]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }